

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u32 jsonTranslateBlobToText(JsonParse *pParse,u32 i,JsonString *pOut)

{
  u8 *puVar1;
  byte bVar2;
  u8 uVar3;
  u32 uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  char cVar9;
  char *pcVar10;
  u8 *puVar11;
  ulong uVar12;
  bool bVar13;
  ulong uStack_50;
  u32 sz;
  ulong local_40;
  ulong local_38;
  
  uVar4 = jsonbPayloadSize(pParse,i,&sz);
  if (uVar4 == 0) {
    pOut->eErr = pOut->eErr | 2;
    return pParse->nBlob + 1;
  }
  puVar11 = pParse->aBlob;
  switch(puVar11[i] & 0xf) {
  case 0:
    pcVar10 = "null";
    goto LAB_00195553;
  case 1:
    pcVar10 = "true";
LAB_00195553:
    uVar4 = 4;
LAB_00195555:
    jsonAppendRawNZ(pOut,pcVar10,uVar4);
    return i + 1;
  case 2:
    pcVar10 = "false";
    uVar4 = 5;
    goto LAB_00195555;
  case 3:
  case 5:
    if (sz != 0) {
      uVar8 = uVar4 + i;
      jsonAppendRaw(pOut,(char *)(puVar11 + uVar8),sz);
      goto LAB_0019560e;
    }
    goto LAB_001955c8;
  case 4:
    if ((ulong)sz != 0) {
      uVar8 = uVar4 + i;
      uVar3 = puVar11[uVar8];
      if (uVar3 == '+') {
LAB_00195594:
        uStack_50 = 3;
      }
      else {
        if (uVar3 == '-') {
          jsonAppendChar(pOut,'-');
          goto LAB_00195594;
        }
        uStack_50 = 2;
      }
      uVar7 = 0;
      bVar13 = false;
      for (; uStack_50 < sz; uStack_50 = uStack_50 + 1) {
        bVar2 = (puVar11 + uVar8)[uStack_50];
        if ((""[bVar2] & 8) == 0) {
          pOut->eErr = pOut->eErr | 2;
          break;
        }
        if (uVar7 >> 0x3c == 0) {
          uVar7 = uVar7 << 4 | (ulong)(((char)(bVar2 * '\x02') >> 7 & 9U) + bVar2 & 0xf);
        }
        else {
          bVar13 = true;
        }
      }
      pcVar10 = "9.0e999";
      if (!bVar13) {
        pcVar10 = "%llu";
      }
      jsonPrintf(100,pOut,pcVar10);
      goto LAB_0019560e;
    }
    goto LAB_001955c8;
  case 6:
    uVar7 = (ulong)sz;
    if (uVar7 != 0) {
      uVar8 = uVar4 + i;
      puVar11 = puVar11 + uVar8;
      uVar3 = *puVar11;
      bVar13 = uVar3 == '-';
      if (bVar13) {
        jsonAppendChar(pOut,'-');
        uVar3 = puVar11[1];
      }
      uVar12 = (ulong)bVar13;
      if (uVar3 == '.') {
        jsonAppendChar(pOut,'0');
      }
      for (; uVar12 < uVar7; uVar12 = uVar12 + 1) {
        jsonAppendChar(pOut,puVar11[uVar12]);
        if ((puVar11[uVar12] == '.') &&
           ((uVar7 - 1 == uVar12 || ((ulong)puVar11[uVar12 + 1] - 0x3a < 0xfffffffffffffff6)))) {
          jsonAppendChar(pOut,'0');
        }
      }
      goto LAB_0019560e;
    }
LAB_001955c8:
    sz = 0;
switchD_001951c6_default:
    pOut->eErr = pOut->eErr | 2;
    uVar8 = uVar4 + i;
    goto LAB_0019560e;
  case 7:
  case 8:
    jsonAppendChar(pOut,'\"');
    uVar8 = uVar4 + i;
    jsonAppendRaw(pOut,(char *)(pParse->aBlob + uVar8),sz);
    cVar9 = '\"';
    break;
  case 9:
    uVar7 = (ulong)sz;
    uVar8 = uVar4 + i;
    puVar11 = puVar11 + uVar8;
    jsonAppendChar(pOut,'\"');
    while (uVar5 = (uint)uVar7, uVar5 != 0) {
      uVar12 = 0;
      while( true ) {
        if (uVar7 == uVar12) {
          jsonAppendRawNZ(pOut,(char *)puVar11,uVar5);
          goto LAB_00195603;
        }
        if (((ulong)puVar11[uVar12] != 0x27) && (""[puVar11[uVar12]] == '\0')) break;
        uVar12 = uVar12 + 1;
      }
      if (uVar12 != 0) {
        jsonAppendRawNZ(pOut,(char *)puVar11,(u32)uVar12);
        puVar11 = puVar11 + uVar12;
        uVar5 = uVar5 - (u32)uVar12;
      }
      uVar3 = *puVar11;
      if (uVar3 == '\"') {
        jsonAppendRawNZ(pOut,"\\\"",2);
LAB_00195401:
        puVar11 = puVar11 + 1;
        uVar7 = (ulong)(uVar5 - 1);
      }
      else {
        if ((char)uVar3 < ' ') {
          if (pOut->nAlloc < pOut->nUsed + 7) {
            iVar6 = jsonStringGrow(pOut,7);
            if (iVar6 != 0) break;
            uVar3 = *puVar11;
          }
          jsonAppendControlChar(pOut,uVar3);
          goto LAB_00195401;
        }
        if (uVar5 < 2) {
          pOut->eErr = pOut->eErr | 2;
          break;
        }
        uVar3 = puVar11[1];
        if (uVar3 != '\n') {
          if (uVar3 == '\r') {
            if (uVar5 == 2) goto LAB_00195519;
            puVar1 = puVar11 + 2;
            if (*puVar1 == '\n') {
              puVar11 = puVar11 + 1;
            }
            uVar5 = uVar5 - (*puVar1 == '\n');
          }
          else if (uVar3 == 0xe2) {
LAB_0019550c:
            pOut->eErr = pOut->eErr | 2;
LAB_00195519:
            uVar5 = 2;
          }
          else {
            if (uVar3 == '0') {
              pcVar10 = "\\u0000";
            }
            else {
              if (uVar3 != 'v') {
                if (uVar3 == 'x') {
                  if (uVar5 < 4) goto LAB_0019550c;
                  jsonAppendRawNZ(pOut,"\\u00",4);
                  jsonAppendRawNZ(pOut,(char *)(puVar11 + 2),2);
                  puVar11 = puVar11 + 2;
                  uVar5 = uVar5 - 2;
                }
                else if (uVar3 == '\'') {
                  jsonAppendChar(pOut,'\'');
                }
                else {
                  jsonAppendRawNZ(pOut,(char *)puVar11,2);
                }
                goto LAB_00195536;
              }
              pcVar10 = "\\u0009";
            }
            jsonAppendRawNZ(pOut,pcVar10,6);
          }
        }
LAB_00195536:
        puVar11 = puVar11 + 2;
        uVar7 = (ulong)(uVar5 - 2);
      }
    }
LAB_00195603:
    cVar9 = '\"';
    break;
  case 10:
    uVar8 = uVar4 + i;
    jsonAppendString(pOut,(char *)(puVar11 + uVar8),sz);
    goto LAB_0019560e;
  case 0xb:
    jsonAppendChar(pOut,'[');
    uVar8 = uVar4 + i;
    local_40 = (ulong)sz;
    uVar5 = uVar8;
    while ((uVar5 < sz + uVar8 && (pOut->eErr == '\0'))) {
      uVar5 = jsonTranslateBlobToText(pParse,uVar5,pOut);
      jsonAppendChar(pOut,',');
    }
    if (sz + uVar8 < uVar5) {
      pOut->eErr = pOut->eErr | 2;
    }
    if (((u32)local_40 != 0) && (pOut->eErr == '\0')) {
      pOut->nUsed = pOut->nUsed - 1;
    }
    cVar9 = ']';
    sz = (u32)local_40;
    break;
  case 0xc:
    jsonAppendChar(pOut,'{');
    uVar4 = uVar4 + i;
    local_38 = (ulong)uVar4;
    local_40 = (ulong)sz;
    uVar8 = sz + uVar4;
    bVar13 = false;
    while ((uVar4 < uVar8 && (pOut->eErr == '\0'))) {
      uVar4 = jsonTranslateBlobToText(pParse,uVar4,pOut);
      cVar9 = ',';
      if (!bVar13) {
        cVar9 = ':';
      }
      jsonAppendChar(pOut,cVar9);
      bVar13 = (bool)(bVar13 ^ 1);
    }
    if (uVar8 < uVar4 || bVar13) {
      pOut->eErr = pOut->eErr | 2;
    }
    uVar8 = (uint)local_38;
    if (((u32)local_40 != 0) && (pOut->eErr == '\0')) {
      pOut->nUsed = pOut->nUsed - 1;
    }
    cVar9 = '}';
    sz = (u32)local_40;
    break;
  default:
    goto switchD_001951c6_default;
  }
  jsonAppendChar(pOut,cVar9);
LAB_0019560e:
  return uVar8 + sz;
}

Assistant:

static u32 jsonTranslateBlobToText(
  const JsonParse *pParse,       /* the complete parse of the JSON */
  u32 i,                         /* Start rendering at this index */
  JsonString *pOut               /* Write JSON here */
){
  u32 sz, n, j, iEnd;

  n = jsonbPayloadSize(pParse, i, &sz);
  if( n==0 ){
    pOut->eErr |= JSTRING_MALFORMED;
    return pParse->nBlob+1;
  }
  switch( pParse->aBlob[i] & 0x0f ){
    case JSONB_NULL: {
      jsonAppendRawNZ(pOut, "null", 4);
      return i+1;
    }
    case JSONB_TRUE: {
      jsonAppendRawNZ(pOut, "true", 4);
      return i+1;
    }
    case JSONB_FALSE: {
      jsonAppendRawNZ(pOut, "false", 5);
      return i+1;
    }
    case JSONB_INT:
    case JSONB_FLOAT: {
      if( sz==0 ) goto malformed_jsonb;
      jsonAppendRaw(pOut, (const char*)&pParse->aBlob[i+n], sz);
      break;
    }
    case JSONB_INT5: {  /* Integer literal in hexadecimal notation */
      u32 k = 2;
      sqlite3_uint64 u = 0;
      const char *zIn = (const char*)&pParse->aBlob[i+n];
      int bOverflow = 0;
      if( sz==0 ) goto malformed_jsonb;
      if( zIn[0]=='-' ){
        jsonAppendChar(pOut, '-');
        k++;
      }else if( zIn[0]=='+' ){
        k++;
      }
      for(; k<sz; k++){
        if( !sqlite3Isxdigit(zIn[k]) ){
          pOut->eErr |= JSTRING_MALFORMED;
          break;
        }else if( (u>>60)!=0 ){
          bOverflow = 1;
        }else{
          u = u*16 + sqlite3HexToInt(zIn[k]);
        }
      }
      jsonPrintf(100,pOut,bOverflow?"9.0e999":"%llu", u);
      break;
    }
    case JSONB_FLOAT5: { /* Float literal missing digits beside "." */
      u32 k = 0;
      const char *zIn = (const char*)&pParse->aBlob[i+n];
      if( sz==0 ) goto malformed_jsonb;
      if( zIn[0]=='-' ){
        jsonAppendChar(pOut, '-');
        k++;
      }
      if( zIn[k]=='.' ){
        jsonAppendChar(pOut, '0');
      }
      for(; k<sz; k++){
        jsonAppendChar(pOut, zIn[k]);
        if( zIn[k]=='.' && (k+1==sz || !sqlite3Isdigit(zIn[k+1])) ){
          jsonAppendChar(pOut, '0');
        }
      }
      break;
    }
    case JSONB_TEXT:
    case JSONB_TEXTJ: {
      jsonAppendChar(pOut, '"');
      jsonAppendRaw(pOut, (const char*)&pParse->aBlob[i+n], sz);
      jsonAppendChar(pOut, '"');
      break;
    }
    case JSONB_TEXT5: {
      const char *zIn;
      u32 k;
      u32 sz2 = sz;
      zIn = (const char*)&pParse->aBlob[i+n];
      jsonAppendChar(pOut, '"');
      while( sz2>0 ){
        for(k=0; k<sz2 && (jsonIsOk[(u8)zIn[k]] || zIn[k]=='\''); k++){}
        if( k>0 ){
          jsonAppendRawNZ(pOut, zIn, k);
          if( k>=sz2 ){
            break;
          }
          zIn += k;
          sz2 -= k;
        }
        if( zIn[0]=='"' ){
          jsonAppendRawNZ(pOut, "\\\"", 2);
          zIn++;
          sz2--;
          continue;
        }
        if( zIn[0]<=0x1f ){
          if( pOut->nUsed+7>pOut->nAlloc && jsonStringGrow(pOut,7) ) break;
          jsonAppendControlChar(pOut, zIn[0]);
          zIn++;
          sz2--;
          continue;
        }
        assert( zIn[0]=='\\' );
        assert( sz2>=1 );
        if( sz2<2 ){
          pOut->eErr |= JSTRING_MALFORMED;
          break;
        }
        switch( (u8)zIn[1] ){
          case '\'':
            jsonAppendChar(pOut, '\'');
            break;
          case 'v':
            jsonAppendRawNZ(pOut, "\\u0009", 6);
            break;
          case 'x':
            if( sz2<4 ){
              pOut->eErr |= JSTRING_MALFORMED;
              sz2 = 2;
              break;
            }
            jsonAppendRawNZ(pOut, "\\u00", 4);
            jsonAppendRawNZ(pOut, &zIn[2], 2);
            zIn += 2;
            sz2 -= 2;
            break;
          case '0':
            jsonAppendRawNZ(pOut, "\\u0000", 6);
            break;
          case '\r':
            if( sz2>2 && zIn[2]=='\n' ){
              zIn++;
              sz2--;
            }
            break;
          case '\n':
            break;
          case 0xe2:
            /* '\' followed by either U+2028 or U+2029 is ignored as
            ** whitespace.  Not that in UTF8, U+2028 is 0xe2 0x80 0x29.
            ** U+2029 is the same except for the last byte */
            if( sz2<4
             || 0x80!=(u8)zIn[2]
             || (0xa8!=(u8)zIn[3] && 0xa9!=(u8)zIn[3])
            ){
              pOut->eErr |= JSTRING_MALFORMED;
              sz2 = 2;
              break;
            }
            zIn += 2;
            sz2 -= 2;
            break;
          default:
            jsonAppendRawNZ(pOut, zIn, 2);
            break;
        }
        assert( sz2>=2 );
        zIn += 2;
        sz2 -= 2;
      }
      jsonAppendChar(pOut, '"');
      break;
    }
    case JSONB_TEXTRAW: {
      jsonAppendString(pOut, (const char*)&pParse->aBlob[i+n], sz);
      break;
    }
    case JSONB_ARRAY: {
      jsonAppendChar(pOut, '[');
      j = i+n;
      iEnd = j+sz;
      while( j<iEnd && pOut->eErr==0 ){
        j = jsonTranslateBlobToText(pParse, j, pOut);
        jsonAppendChar(pOut, ',');
      }
      if( j>iEnd ) pOut->eErr |= JSTRING_MALFORMED;
      if( sz>0 ) jsonStringTrimOneChar(pOut);
      jsonAppendChar(pOut, ']');
      break;
    }
    case JSONB_OBJECT: {
      int x = 0;
      jsonAppendChar(pOut, '{');
      j = i+n;
      iEnd = j+sz;
      while( j<iEnd && pOut->eErr==0 ){
        j = jsonTranslateBlobToText(pParse, j, pOut);
        jsonAppendChar(pOut, (x++ & 1) ? ',' : ':');
      }
      if( (x & 1)!=0 || j>iEnd ) pOut->eErr |= JSTRING_MALFORMED;
      if( sz>0 ) jsonStringTrimOneChar(pOut);
      jsonAppendChar(pOut, '}');
      break;
    }

    default: {
      malformed_jsonb:
      pOut->eErr |= JSTRING_MALFORMED;
      break;
    }
  }
  return i+n+sz;
}